

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O2

QDebug operator<<(QDebug *d,QDnsLookupRunnable *r)

{
  Stream *pSVar1;
  bool bVar2;
  QDebug *pQVar3;
  void *t;
  unsigned_short t_00;
  long in_RDX;
  unsigned_short uVar4;
  long in_FS_OFFSET;
  QDebug local_60;
  undefined1 local_58 [8];
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::left((QByteArray *)&local_50,(QByteArray *)(in_RDX + 0x20),0xff);
  QDebug::operator<<((QDebug *)r,(QByteArray *)&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_50);
  if (0xff < *(ulong *)(in_RDX + 0x30)) {
    QDebug::operator<<((QDebug *)r,"... (truncated)");
  }
  pQVar3 = QDebug::operator<<((QDebug *)r," type ");
  local_60.stream = pQVar3->stream;
  *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
  operator<<((Stream *)local_58,(Type)&local_60);
  QDebug::~QDebug((QDebug *)local_58);
  QDebug::~QDebug(&local_60);
  bVar2 = QHostAddress::isNull((QHostAddress *)(in_RDX + 0x38));
  if (!bVar2) {
    pQVar3 = QDebug::operator<<((QDebug *)r," to nameserver ");
    QHostAddress::toString((QString *)&local_50,(QHostAddress *)(in_RDX + 0x38));
    t = (void *)QString::utf16();
    pQVar3 = QDebug::operator<<(pQVar3,t);
    pQVar3 = QDebug::operator<<(pQVar3," port ");
    t_00 = *(unsigned_short *)(in_RDX + 0x44);
    if (*(unsigned_short *)(in_RDX + 0x44) == 0) {
      uVar4 = 0x355;
      if (*(char *)(in_RDX + 0x46) != '\x01') {
        uVar4 = 0;
      }
      t_00 = 0x35;
      if (*(char *)(in_RDX + 0x46) != '\0') {
        t_00 = uVar4;
      }
    }
    QDebug::operator<<(pQVar3,t_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (*(char *)(in_RDX + 0x46) == '\x01') {
      QDebug::operator<<((QDebug *)r," (TLS)");
    }
  }
  pSVar1 = *(Stream **)r;
  d->stream = pSVar1;
  pSVar1 = pSVar1 + 0x28;
  *(int *)pSVar1 = *(int *)pSVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)(Stream *)d;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug &d, QDnsLookupRunnable *r)
{
    // continued: print the information about the request
    d << r->requestName.left(MaxDomainNameLength);
    if (r->requestName.size() > MaxDomainNameLength)
        d << "... (truncated)";
    d << " type " << r->requestType;
    if (!r->nameserver.isNull()) {
        d << " to nameserver " << qUtf16Printable(r->nameserver.toString())
          << " port " << (r->port ? r->port : QDnsLookup::defaultPortForProtocol(r->protocol));
        switch (r->protocol) {
        case QDnsLookup::Standard:
            break;
        case QDnsLookup::DnsOverTls:
            d << " (TLS)";
        }
    }
    return d;
}